

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# WasmBinaryReader.cpp
# Opt level: O3

void __thiscall Wasm::WasmBinaryReader::ReadFunctionHeaders(WasmBinaryReader *this)

{
  code *pcVar1;
  bool bVar2;
  uint uVar3;
  uint32 uVar4;
  uint uVar5;
  uint sourceContextId;
  undefined4 *puVar6;
  WasmBinaryReader *this_00;
  FunctionInfo *pFVar7;
  FunctionBody *pFVar8;
  char16_t *msg;
  WebAssemblyModule *this_01;
  uint index;
  FunctionBodyReaderInfo info;
  uint32 local_38;
  uint local_34;
  uint32 len;
  
  uVar3 = LEB128<unsigned_int,32u>(this,&local_38);
  this_01 = this->m_module;
  index = this_01->m_importedFunctionCount;
  uVar4 = Js::WebAssemblyModule::GetWasmFunctionCount(this_01);
  if (index <= uVar4) {
    this_01 = this->m_module;
    uVar4 = Js::WebAssemblyModule::GetWasmFunctionCount(this_01);
    if (uVar3 == uVar4 - index) {
      if (uVar3 != 0) {
        puVar6 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
        do {
          this_00 = (WasmBinaryReader *)
                    Js::WebAssemblyModule::GetWasmFunctionInfo(this->m_module,index);
          this_01 = (WebAssemblyModule *)this;
          uVar5 = LEB128<unsigned_int,32u>(this,&local_38);
          if ((0x74cbb1 < uVar5) && (DAT_015932e2 == '\0')) {
            msg = L"Function body too big";
            goto LAB_00f11f43;
          }
          info.startOffset = (long)this->m_pc - (long)this->m_start;
          info._4_4_ = 0;
          info.size = uVar5;
          WasmFunctionInfo::SetReaderInfo((WasmFunctionInfo *)this_00,info);
          if ((uint)(*(int *)&this->m_end - *(int *)&this->m_pc) < uVar5) {
            ThrowDecodingError(this_00,L"Out of file: Needed: %d, Left: %d",(ulong)uVar5);
          }
          pFVar8 = (this->m_funcState).body;
          if (pFVar8 == (FunctionBody *)0x0 || this->m_readerState != READER_STATE_FUNCTION) {
            bVar2 = Js::Phases::IsEnabled((Phases *)&DAT_015b6718,WasmReaderPhase);
          }
          else {
            sourceContextId = Js::FunctionProxy::GetSourceContextId((FunctionProxy *)pFVar8);
            if (this->m_readerState == READER_STATE_FUNCTION) {
              pFVar8 = (this->m_funcState).body;
            }
            else {
              pFVar8 = (FunctionBody *)0x0;
            }
            pFVar7 = (pFVar8->super_ParseableFunctionInfo).super_FunctionProxy.functionInfo.ptr;
            if (pFVar7 == (FunctionInfo *)0x0) {
              AssertCount = AssertCount + 1;
              local_34 = sourceContextId;
              Js::Throw::LogAssert();
              *puVar6 = 1;
              bVar2 = Js::Throw::ReportAssert
                                ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/WasmReader/../Runtime/Base/FunctionBody.h"
                                 ,0x4c1,"(GetFunctionInfo())","GetFunctionInfo()");
              if (!bVar2) {
                pcVar1 = (code *)invalidInstructionException();
                (*pcVar1)();
              }
              *puVar6 = 0;
              pFVar7 = (pFVar8->super_ParseableFunctionInfo).super_FunctionProxy.functionInfo.ptr;
              sourceContextId = local_34;
            }
            bVar2 = Js::Phases::IsEnabled
                              ((Phases *)&DAT_015b6718,WasmReaderPhase,sourceContextId,
                               pFVar7->functionId);
          }
          if (bVar2 != false) {
            Output::Print(L"Function body header: index = %u, size = %u",(ulong)index,(ulong)uVar5);
            Output::Print(L"\n");
            Output::Flush();
          }
          this->m_pc = this->m_pc + uVar5;
          index = index + 1;
          uVar3 = uVar3 - 1;
        } while (uVar3 != 0);
      }
      return;
    }
  }
  msg = L"Function signatures and function bodies count mismatch";
LAB_00f11f43:
  ThrowDecodingError((WasmBinaryReader *)this_01,msg);
}

Assistant:

void WasmBinaryReader::ReadFunctionHeaders()
{
    uint32 len;
    uint32 entries = LEB128(len);
    uint32 importCount = m_module->GetImportedFunctionCount();
    if (m_module->GetWasmFunctionCount() < importCount ||
        entries != m_module->GetWasmFunctionCount() - importCount)
    {
        ThrowDecodingError(_u("Function signatures and function bodies count mismatch"));
    }

    for (uint32 i = 0; i < entries; ++i)
    {
        uint32 funcIndex = i + importCount;
        WasmFunctionInfo* funcInfo = m_module->GetWasmFunctionInfo(funcIndex);

        const uint32 funcSize = LEB128(len);
        if (funcSize > Limits::GetMaxFunctionSize())
        {
            ThrowDecodingError(_u("Function body too big"));
        }
        funcInfo->SetReaderInfo(FunctionBodyReaderInfo(funcSize, (m_pc - m_start)));
        CheckBytesLeft(funcSize);
        TRACE_WASM_DECODER(_u("Function body header: index = %u, size = %u"), funcIndex, funcSize);
        const byte* end = m_pc + funcSize;
        m_pc = end;
    }
}